

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::CubicSpline::sort_permutation
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CubicSpline *this,
          vector<double,_std::allocator<double>_> *v)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer pdVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  int *piVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  int iVar13;
  undefined1 auVar12 [16];
  int iVar14;
  int iVar17;
  undefined1 auVar16 [16];
  allocator_type local_29;
  undefined1 auVar15 [16];
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_29);
  auVar8 = _DAT_001e3ce0;
  auVar7 = _DAT_001e3cd0;
  auVar6 = _DAT_001e3cc0;
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    lVar11 = (long)__last._M_current - (long)__first._M_current;
    uVar1 = lVar11 - 4;
    auVar16._8_4_ = (int)uVar1;
    auVar16._0_8_ = uVar1;
    auVar16._12_4_ = (int)(uVar1 >> 0x20);
    auVar12._0_8_ = uVar1 >> 2;
    auVar12._8_8_ = auVar16._8_8_ >> 2;
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_001e3ce0;
    do {
      iVar14 = (int)uVar9;
      auVar15._8_4_ = iVar14;
      auVar15._0_8_ = uVar9;
      auVar15._12_4_ = (int)(uVar9 >> 0x20);
      auVar16 = (auVar15 | auVar7) ^ auVar8;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                  iVar13 < auVar16._4_4_) & 1)) {
        __first._M_current[uVar9] = iVar14;
      }
      if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
          auVar16._12_4_ <= auVar12._12_4_) {
        __first._M_current[uVar9 + 1] = iVar14 + 1;
      }
      auVar16 = (auVar15 | auVar6) ^ auVar8;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar16._0_4_ <= auVar12._0_4_)) {
        __first._M_current[uVar9 + 2] = iVar14 + 2;
        __first._M_current[uVar9 + 3] = iVar14 + 3;
      }
      uVar9 = uVar9 + 4;
    } while (((uVar1 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
    lVar5 = 0x3f;
    if (lVar11 >> 2 != 0) {
      for (; (ulong)(lVar11 >> 2) >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>>
              (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_OpenMD[P]OpenMD_src_math_CubicSpline_cpp:331:35)>
                )v);
    if (lVar11 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_OpenMD[P]OpenMD_src_math_CubicSpline_cpp:331:35)>
                  )v);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_OpenMD[P]OpenMD_src_math_CubicSpline_cpp:331:35)>
                  )v);
      if (__last_00._M_current != __last._M_current) {
        pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar13 = *__last_00._M_current;
          dVar2 = pdVar4[iVar13];
          lVar11 = (long)__last_00._M_current[-1];
          dVar3 = pdVar4[lVar11];
          piVar10 = __last_00._M_current;
          while (dVar2 < dVar3) {
            *piVar10 = (int)lVar11;
            lVar11 = (long)piVar10[-2];
            piVar10 = piVar10 + -1;
            dVar3 = pdVar4[lVar11];
          }
          *piVar10 = iVar13;
          __last_00._M_current = __last_00._M_current + 1;
        } while (__last_00._M_current != __last._M_current);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> CubicSpline::sort_permutation(
      const std::vector<double>& v) const {
    std::vector<int> p(v.size());

    std::iota(p.begin(), p.end(), 0);
    std::sort(p.begin(), p.end(), [&v](int a, int b) { return (v[a] < v[b]); });

    return p;
  }